

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_SMC(DisasContext_conflict1 *s,arg_SMC *a)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar1;
  uint uVar2;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  uVar2 = (uint)s->features & 0x210;
  if (uVar2 == 0x10) {
    if (s->user == 0) {
      tcg_ctx = s->uc->tcg_ctx;
      gen_set_pc_im(s,s->pc_curr);
      pTVar1 = tcg_const_i32_aarch64(tcg_ctx,0x4e000000);
      local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_30 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,helper_pre_smc_aarch64,(TCGTemp *)0x0,2,&local_38);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
      gen_set_pc_im(s,(s->base).pc_next);
      (s->base).is_jmp = DISAS_TARGET_6;
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return uVar2 == 0x10;
}

Assistant:

static bool trans_SMC(DisasContext *s, arg_SMC *a)
{
    if (!ENABLE_ARCH_6K || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
    } else {
        gen_smc(s);
    }
    return true;
}